

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_edge.cpp
# Opt level: O2

void check_tlist(tri_idx_list_t *tlist,uint *N)

{
  CoeffReturnType puVar1;
  ostream *poVar2;
  runtime_error *this;
  ulong uVar3;
  long index;
  string asStack_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  uVar3 = 0;
  do {
    if ((ulong)(((long)(tlist->
                       super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(tlist->
                      super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0xc) <= uVar3) {
      return;
    }
    index = -1;
    while (index != 2) {
      index = index + 1;
      Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0> *)
                 ((tlist->
                  super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar3),index);
      puVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0> *)
                          ((tlist->
                           super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar3),index);
      if (*N <= *puVar1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar2 = std::operator<<(local_1a8,"Failed to ensure condition ");
        poVar2 = std::operator<<(poVar2,"is_in_range(tlist[t][v],0,N)");
        poVar2 = std::operator<<(poVar2,"\n");
        poVar2 = std::operator<<(poVar2,"at (");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/tri_edge.cpp"
                                );
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = std::operator<<(poVar2,"check_tlist");
        poVar2 = std::operator<<(poVar2,",");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2a0);
        poVar2 = std::operator<<(poVar2,") \n ");
        poVar2 = std::operator<<(poVar2,"tri vertex out of range");
        poVar2 = std::operator<<(poVar2,"t");
        poVar2 = std::operator<<(poVar2," = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar3);
        poVar2 = std::operator<<(poVar2,"tlist[t][v]");
        poVar2 = std::operator<<(poVar2," = ");
        Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0>::operator[]
                  ((DenseCoeffsBase<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_0> *)
                   ((tlist->
                    super__Vector_base<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<unsigned_int,_1,_3,_1,_1,_3>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar3),index);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::endl<char,std::char_traits<char>>(poVar2);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this,asStack_1d8);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void check_tlist(const tri_cc_t::tri_idx_list_t &tlist,const uint & N)
{
  for ( int t = 0 ; t < tlist.size(); ++t )
  {
    for( int v = 0 ; v < 3 ; ++v)
    {
      ENSURES(is_in_range(tlist[t][v],0,N))
          << "tri vertex out of range"
          <<STRMVAR(t)
          <<STRMVAR(tlist[t][v])
          <<endl;
    }
  }
}